

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::setButtonText(QMessageBox *this,int button,QString *text)

{
  QMessageBoxPrivate *this_00;
  QAbstractButton *this_01;
  QPushButton *this_02;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_01 = QMessageBoxPrivate::abstractButtonForId(this_00,button);
  if (this_01 == (QAbstractButton *)0x0) {
    QDialogButtonBox::buttons
              ((QList<QAbstractButton_*> *)&QStack_48,(QDialogButtonBox *)this_00->buttonBox);
    QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&QStack_48);
    if ((QStack_48.size == 0) && ((button == 0x400 || (button == 1)))) {
      this_02 = addButton(this,FirstButton);
      QAbstractButton::setText(&this_02->super_QAbstractButton,text);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QAbstractButton::setText(this_01,text);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setButtonText(int button, const QString &text)
{
    Q_D(QMessageBox);
    if (QAbstractButton *abstractButton = d->abstractButtonForId(button)) {
        abstractButton->setText(text);
    } else if (d->buttonBox->buttons().isEmpty() && (button == Ok || button == Old_Ok)) {
        // for compatibility with Qt 4.0/4.1
        addButton(QMessageBox::Ok)->setText(text);
    }
}